

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O3

string * __thiscall
flatbuffers::anon_unknown_0::NimBfbsGenerator::GenerateGetter
          (string *__return_storage_ptr__,NimBfbsGenerator *this,Type *type,string *offsetval,
          bool element_type)

{
  pointer pcVar1;
  ushort uVar2;
  long lVar3;
  Enum *pEVar4;
  long *plVar5;
  undefined8 *puVar6;
  string *extraout_RAX;
  string *psVar7;
  long *plVar8;
  size_type *psVar9;
  ulong *puVar10;
  BaseType base_type;
  ulong uVar11;
  undefined8 uVar12;
  undefined1 enum_inner;
  undefined7 in_register_00000081;
  uint uVar13;
  string offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  string local_118;
  string local_f8;
  undefined1 local_d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  uVar12 = CONCAT71(in_register_00000081,element_type);
  lVar3 = -(long)*(int *)type;
  if ((int)uVar12 == 0) {
    uVar13 = 0;
    if (4 < *(ushort *)(type + -(long)*(int *)type)) {
      uVar2 = *(ushort *)(type + lVar3 + 4);
      goto LAB_0032faa0;
    }
  }
  else {
    uVar13 = 0;
    if (6 < *(ushort *)(type + -(long)*(int *)type)) {
      uVar2 = *(ushort *)(type + lVar3 + 6);
LAB_0032faa0:
      uVar13 = 0;
      if (uVar2 != 0) {
        uVar13 = (int)(char)type[uVar2].super_Table;
      }
    }
  }
  local_d8._0_8_ = local_d8 + 0x10;
  pcVar1 = (offsetval->_M_dataplus)._M_p;
  local_b8._M_allocated_capacity = (size_type)this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d8,pcVar1,pcVar1 + offsetval->_M_string_length);
  enum_inner = (undefined1)uVar12;
  if (!element_type) {
    std::operator+(&local_158,"self.tab.Pos + ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
    std::__cxx11::string::operator=((string *)local_d8,(string *)&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
  }
  uVar12 = local_b8._M_allocated_capacity;
  switch(uVar13) {
  case 0xd:
    std::operator+(&local_158,"self.tab.String(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_158);
    goto LAB_0032fbde;
  case 0xe:
    GenerateGetter(__return_storage_ptr__,(NimBfbsGenerator *)local_b8._M_allocated_capacity,type,
                   offsetval,true);
    goto LAB_00330359;
  case 0xf:
    (anonymous_namespace)::NimBfbsGenerator::GenerateType_abi_cxx11_
              (&local_118,(void *)local_b8._M_allocated_capacity,type,element_type,(bool)enum_inner)
    ;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_118);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_128 = *plVar8;
      lStack_120 = plVar5[3];
      local_138 = &local_128;
    }
    else {
      local_128 = *plVar8;
      local_138 = (long *)*plVar5;
    }
    local_130 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_138,local_d8._0_8_);
    psVar9 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_158.field_2._M_allocated_capacity = *psVar9;
      local_158.field_2._8_8_ = puVar6[3];
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar9;
      local_158._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_158._M_string_length = puVar6[1];
    *puVar6 = psVar9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_158);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar9) {
      lVar3 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    local_50.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_118._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p == &local_118.field_2) goto LAB_00330359;
    break;
  case 0x10:
    std::operator+(&local_158,"self.tab.Union(",offsetval);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_158);
LAB_0032fbde:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar9) {
      lVar3 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_50.field_2._M_allocated_capacity = local_158.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_158._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p == &local_158.field_2) goto LAB_00330359;
    break;
  default:
    pEVar4 = BaseBfbsGenerator::GetEnum
                       ((BaseBfbsGenerator *)local_b8._M_allocated_capacity,type,element_type);
    if (pEVar4 == (Enum *)0x0) {
      (anonymous_namespace)::NimBfbsGenerator::GenerateType_abi_cxx11_
                (&local_f8,(void *)(ulong)uVar13,base_type);
      puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x3810ba);
      psVar9 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_118.field_2._M_allocated_capacity = *psVar9;
        local_118.field_2._8_8_ = puVar6[3];
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar9;
        local_118._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_118._M_string_length = puVar6[1];
      *puVar6 = psVar9;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_118);
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_128 = *plVar8;
        lStack_120 = plVar5[3];
        local_138 = &local_128;
      }
      else {
        local_128 = *plVar8;
        local_138 = (long *)*plVar5;
      }
      local_130 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_138,local_d8._0_8_);
      psVar9 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_158.field_2._M_allocated_capacity = *psVar9;
        local_158.field_2._8_8_ = puVar6[3];
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      }
      else {
        local_158.field_2._M_allocated_capacity = *psVar9;
        local_158._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_158._M_string_length = puVar6[1];
      *puVar6 = psVar9;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_158);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar9) {
        lVar3 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138,local_128 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      local_50.field_2._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p == &local_f8.field_2) goto LAB_00330359;
    }
    else {
      (anonymous_namespace)::NimBfbsGenerator::GenerateType_abi_cxx11_
                (&local_50,(void *)uVar12,type,element_type,(bool)enum_inner);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_60 = *plVar8;
        lStack_58 = plVar5[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar8;
        local_70 = (long *)*plVar5;
      }
      local_68 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      puVar10 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar10) {
        local_a0 = *puVar10;
        lStack_98 = plVar5[3];
        local_b8._8_8_ = &local_a0;
      }
      else {
        local_a0 = *puVar10;
        local_b8._8_8_ = (ulong *)*plVar5;
      }
      local_a8 = plVar5[1];
      *plVar5 = (long)puVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      (anonymous_namespace)::NimBfbsGenerator::GenerateType_abi_cxx11_
                (&local_90,(void *)(ulong)uVar13,(BaseType)local_a8);
      uVar11 = 0xf;
      if ((ulong *)local_b8._8_8_ != &local_a0) {
        uVar11 = local_a0;
      }
      if (uVar11 < local_90._M_string_length + local_a8) {
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          uVar12 = local_90.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_90._M_string_length + local_a8) goto LAB_0032ff3c;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,local_b8._8_8_);
      }
      else {
LAB_0032ff3c:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           (local_b8._M_local_buf + 8,(ulong)local_90._M_dataplus._M_p);
      }
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      psVar9 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_f8.field_2._M_allocated_capacity = *psVar9;
        local_f8.field_2._8_8_ = puVar6[3];
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar9;
        local_f8._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_f8._M_string_length = puVar6[1];
      *puVar6 = psVar9;
      puVar6[1] = 0;
      *(undefined1 *)psVar9 = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
      psVar9 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_118.field_2._M_allocated_capacity = *psVar9;
        local_118.field_2._8_8_ = puVar6[3];
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar9;
        local_118._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_118._M_string_length = puVar6[1];
      *puVar6 = psVar9;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_118,local_d8._0_8_);
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_128 = *plVar8;
        lStack_120 = plVar5[3];
        local_138 = &local_128;
      }
      else {
        local_128 = *plVar8;
        local_138 = (long *)*plVar5;
      }
      local_130 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
      psVar9 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_158.field_2._M_allocated_capacity = *psVar9;
        local_158.field_2._8_8_ = puVar6[3];
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      }
      else {
        local_158.field_2._M_allocated_capacity = *psVar9;
        local_158._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_158._M_string_length = puVar6[1];
      *puVar6 = psVar9;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_158);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar9) {
        lVar3 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138,local_128 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((ulong *)local_b8._8_8_ != &local_a0) {
        operator_delete((void *)local_b8._8_8_,local_a0 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_00330359;
    }
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
LAB_00330359:
  psVar7 = (string *)(local_d8 + 0x10);
  if ((string *)local_d8._0_8_ != psVar7) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    psVar7 = extraout_RAX;
  }
  return psVar7;
}

Assistant:

std::string GenerateGetter(const r::Type *type, const std::string &offsetval,
                             bool element_type = false) const {
    const r::BaseType base_type =
        element_type ? type->element() : type->base_type();
    std::string offset = offsetval;
    if (!element_type) { offset = "self.tab.Pos + " + offset; }
    switch (base_type) {
      case r::String: return "self.tab.String(" + offset + ")";
      case r::Union: return "self.tab.Union(" + offsetval + ")";
      case r::Obj: {
        return GenerateType(type, element_type) +
               "(tab: Vtable(Bytes: self.tab.Bytes, Pos: " + offset + "))";
      }
      case r::Vector: return GenerateGetter(type, offsetval, true);
      default:
        const r::Enum *type_enum = GetEnum(type, element_type);
        if (type_enum != nullptr) {
          return GenerateType(type, element_type) + "(" + "Get[" +
                 GenerateType(base_type) + "](self.tab, " + offset + ")" + ")";
        } else {
          return "Get[" + GenerateType(base_type) + "](self.tab, " + offset +
                 ")";
        }
    }
  }